

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

void cnn::GraphOptimize(ComputationGraph *cg)

{
  pointer pVVar1;
  Node *pNVar2;
  ComputationGraph *pCVar3;
  pointer ppNVar4;
  ostream *poVar5;
  pointer ppNVar6;
  ulong uVar7;
  pointer pVVar8;
  uint uVar9;
  int weight;
  int iVar10;
  long lVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  x;
  vector<int,_std::allocator<int>_> longest_paths;
  allocator local_d9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  ComputationGraph *local_b8;
  ulong local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  vector<int,_std::allocator<int>_> local_88;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&local_88,
             (long)(cg->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(cg->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl
                   .super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_a8);
  ppNVar4 = (cg->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar6 = (cg->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (uVar9 = 0; uVar7 = (ulong)uVar9, uVar7 < (ulong)((long)ppNVar6 - (long)ppNVar4 >> 3);
      uVar9 = uVar9 + 1) {
    pVVar8 = *(pointer *)
              &(ppNVar4[uVar7]->args).
               super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl;
    pVVar1 = (ppNVar4[uVar7]->args).
             super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar11 = (long)pVVar1 - (long)pVVar8;
    for (; pVVar8 != pVVar1; pVVar8 = pVVar8 + 1) {
      iVar10 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[pVVar8->t] + (uint)(lVar11 == 0x1c);
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar7] < iVar10) {
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar7] = iVar10;
      }
    }
  }
  uVar9 = 0;
  local_b8 = cg;
  while (uVar7 = (ulong)uVar9, uVar7 < (ulong)((long)ppNVar6 - (long)ppNVar4 >> 3)) {
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pVVar1 = (ppNVar4[uVar7]->args).
             super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_b0 = uVar7;
    for (pVVar8 = *(pointer *)
                   &(ppNVar4[uVar7]->args).
                    super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                    _M_impl; pVVar8 != pVVar1; pVVar8 = pVVar8 + 1) {
      uVar9 = pVVar8->t;
      std::__cxx11::string::string((string *)&local_50,"x",&local_d9);
      std::__cxx11::to_string(&local_70,uVar9);
      std::operator+(&local_a8,&local_50,&local_70);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
                 &local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"LONGEST PATH: ");
    uVar7 = local_b0;
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_b0]);
    poVar5 = std::operator<<(poVar5,"\tx");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," = ");
    pCVar3 = local_b8;
    pNVar2 = (local_b8->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl
             .super__Vector_impl_data._M_start[uVar7];
    (*pNVar2->_vptr_Node[3])(&local_a8,pNVar2,&local_d8);
    poVar5 = std::operator<<(poVar5,(string *)&local_a8);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d8);
    ppNVar4 = (pCVar3->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppNVar6 = (pCVar3->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar9 = (int)uVar7 + 1;
  }
  abort();
}

Assistant:

void GraphOptimize(ComputationGraph* cg) {
  // topo sort
  vector<Node*>& nodes = cg->nodes;
  vector<int> longest_paths(nodes.size());
  for (unsigned i = 0; i < nodes.size(); ++i) {
    auto& v = *nodes[i];  // vertex v_i
    auto& lp = longest_paths[i]; // distance to v_i
    for (auto e : v.args) {
      int weight = 0;
      if (v.args.size() == 7) weight = 1;
      int pte = longest_paths[e] + weight;
      if (pte > lp) lp = pte;
    }
  }
  for (unsigned i = 0; i < nodes.size(); ++i) {
    vector<string> x;
    for (auto e : nodes[i]->args) {
      x.push_back(string("x") + to_string(e));
    }
    cerr << "LONGEST PATH: " << longest_paths[i] << "\tx" << i << " = " << nodes[i]->as_string(x) << endl;
  }
  abort();// DEBUGGING
}